

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_parser_test.cpp
# Opt level: O0

void __thiscall
bioparser::test::BioparserSamTest_ParseInChunks_Test::TestBody
          (BioparserSamTest_ParseInChunks_Test *this)

{
  bool bVar1;
  pointer pPVar2;
  vector<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_>_>
  *this_00;
  vector<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_>_>
  local_b0;
  unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>
  *local_98;
  unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>
  *local_90;
  __normal_iterator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_*,_std::vector<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_>_>_>
  local_88;
  unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>
  *local_80;
  move_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_*,_std::vector<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_>_>_>_>
  local_78;
  __normal_iterator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_*,_std::vector<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_>_>_>
  local_70;
  const_iterator local_68;
  undefined1 local_60 [8];
  vector<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_>_>
  t;
  allocator local_31;
  string local_30;
  BioparserSamTest_ParseInChunks_Test *local_10;
  BioparserSamTest_ParseInChunks_Test *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"sample.sam",&local_31);
  BioparserSamTest::Setup(&this->super_BioparserSamTest,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  pPVar2 = std::
           unique_ptr<bioparser::Parser<bioparser::test::SamOverlap>,_std::default_delete<bioparser::Parser<bioparser::test::SamOverlap>_>_>
           ::operator->(&(this->super_BioparserSamTest).p);
  (*pPVar2->_vptr_Parser[2])(local_60,pPVar2,0x400,1);
  while( true ) {
    bVar1 = std::
            vector<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_>_>
            ::empty((vector<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_>_>
                     *)local_60);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    this_00 = &(this->super_BioparserSamTest).o;
    local_70._M_current =
         (unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>
          *)std::
            vector<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_>_>
            ::end(this_00);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<bioparser::test::SamOverlap,std::default_delete<bioparser::test::SamOverlap>>const*,std::vector<std::unique_ptr<bioparser::test::SamOverlap,std::default_delete<bioparser::test::SamOverlap>>,std::allocator<std::unique_ptr<bioparser::test::SamOverlap,std::default_delete<bioparser::test::SamOverlap>>>>>
    ::
    __normal_iterator<std::unique_ptr<bioparser::test::SamOverlap,std::default_delete<bioparser::test::SamOverlap>>*>
              ((__normal_iterator<std::unique_ptr<bioparser::test::SamOverlap,std::default_delete<bioparser::test::SamOverlap>>const*,std::vector<std::unique_ptr<bioparser::test::SamOverlap,std::default_delete<bioparser::test::SamOverlap>>,std::allocator<std::unique_ptr<bioparser::test::SamOverlap,std::default_delete<bioparser::test::SamOverlap>>>>>
                *)&local_68,&local_70);
    local_80 = (unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>
                *)std::
                  vector<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_>_>
                  ::begin((vector<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_>_>
                           *)local_60);
    local_78 = std::
               make_move_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<bioparser::test::SamOverlap,std::default_delete<bioparser::test::SamOverlap>>*,std::vector<std::unique_ptr<bioparser::test::SamOverlap,std::default_delete<bioparser::test::SamOverlap>>,std::allocator<std::unique_ptr<bioparser::test::SamOverlap,std::default_delete<bioparser::test::SamOverlap>>>>>>
                         ((__normal_iterator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_*,_std::vector<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_>_>_>
                           )local_80);
    local_90 = (unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>
                *)std::
                  vector<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_>_>
                  ::end((vector<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_>_>
                         *)local_60);
    local_88._M_current =
         (unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>
          *)std::
            make_move_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<bioparser::test::SamOverlap,std::default_delete<bioparser::test::SamOverlap>>*,std::vector<std::unique_ptr<bioparser::test::SamOverlap,std::default_delete<bioparser::test::SamOverlap>>,std::allocator<std::unique_ptr<bioparser::test::SamOverlap,std::default_delete<bioparser::test::SamOverlap>>>>>>
                      ((__normal_iterator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_*,_std::vector<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_>_>_>
                        )local_90);
    local_98 = (unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>
                *)std::
                  vector<std::unique_ptr<bioparser::test::SamOverlap,std::default_delete<bioparser::test::SamOverlap>>,std::allocator<std::unique_ptr<bioparser::test::SamOverlap,std::default_delete<bioparser::test::SamOverlap>>>>
                  ::
                  insert<std::move_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<bioparser::test::SamOverlap,std::default_delete<bioparser::test::SamOverlap>>*,std::vector<std::unique_ptr<bioparser::test::SamOverlap,std::default_delete<bioparser::test::SamOverlap>>,std::allocator<std::unique_ptr<bioparser::test::SamOverlap,std::default_delete<bioparser::test::SamOverlap>>>>>>,void>
                            ((vector<std::unique_ptr<bioparser::test::SamOverlap,std::default_delete<bioparser::test::SamOverlap>>,std::allocator<std::unique_ptr<bioparser::test::SamOverlap,std::default_delete<bioparser::test::SamOverlap>>>>
                              *)this_00,local_68,local_78,
                             (move_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_*,_std::vector<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_>_>_>_>
                              )local_88._M_current);
    pPVar2 = std::
             unique_ptr<bioparser::Parser<bioparser::test::SamOverlap>,_std::default_delete<bioparser::Parser<bioparser::test::SamOverlap>_>_>
             ::operator->(&(this->super_BioparserSamTest).p);
    (*pPVar2->_vptr_Parser[2])(&local_b0,pPVar2,0x400,1);
    std::
    vector<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_>_>
    ::operator=((vector<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_>_>
                 *)local_60,&local_b0);
    std::
    vector<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_>_>
    ::~vector(&local_b0);
  }
  std::
  vector<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_>_>
  ::~vector((vector<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_>_>
             *)local_60);
  BioparserSamTest::Check(&this->super_BioparserSamTest);
  return;
}

Assistant:

TEST_F(BioparserSamTest, ParseInChunks) {
  Setup("sample.sam");
  for (auto t = p->Parse(1024); !t.empty(); t = p->Parse(1024)) {
    o.insert(
        o.end(),
        std::make_move_iterator(t.begin()),
        std::make_move_iterator(t.end()));
  }
  Check();
}